

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.h
# Opt level: O1

int util::str_value<int>(string *str)

{
  char *__nptr;
  int iVar1;
  int iVar2;
  int *piVar3;
  long lVar4;
  undefined8 uVar5;
  exception *this;
  char (*in_R8) [2];
  string local_70;
  string local_50;
  
  std::__cxx11::string::substr((ulong)&local_50,(ulong)str);
  lowercase(&local_70,&local_50);
  iVar1 = std::__cxx11::string::compare((char *)&local_70);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  iVar2 = 10;
  if (iVar1 == 0) {
    iVar2 = 0x10;
  }
  __nptr = (str->_M_dataplus)._M_p;
  piVar3 = __errno_location();
  iVar1 = *piVar3;
  *piVar3 = 0;
  lVar4 = strtol(__nptr,(char **)&local_70,iVar2);
  if (local_70._M_dataplus._M_p == __nptr) {
    std::__throw_invalid_argument("stoi");
  }
  else {
    iVar2 = (int)lVar4;
    if (iVar2 == lVar4) {
      if (*piVar3 != 0x22) {
        if (*piVar3 == 0) {
          *piVar3 = iVar1;
        }
        if ((-1 < iVar2) &&
           ((long)local_70._M_dataplus._M_p - (long)__nptr == str->_M_string_length)) {
          return iVar2;
        }
        goto LAB_00169c9e;
      }
    }
  }
  uVar5 = std::__throw_out_of_range("stoi");
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  __cxa_begin_catch(uVar5);
  __cxa_end_catch();
LAB_00169c9e:
  this = (exception *)__cxa_allocate_exception(0x10);
  format<char_const*,std::__cxx11::string_const&,char_const(&)[2]>
            (&local_70,(util *)"invalid value \'",(char *)str,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x1afe5f,in_R8);
  exception::exception<std::__cxx11::string>(this,&local_70);
  __cxa_throw(this,&exception::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

T str_value(const std::string& str)
{
    static_assert(std::is_same<T, int>::value || std::is_same<T, long>::value, "int or long only");
    try
    {
        size_t idx_end = 0;
        auto hex = util::lowercase(str.substr(0, 2)) == "0x";
        T n{};
        if (std::is_same<T, int>::value)
            n = std::stoi(str, &idx_end, hex ? 16 : 10);
        else
            n = std::stol(str, &idx_end, hex ? 16 : 10);
        if (idx_end == str.size() && n >= 0)
            return n;
    }
    catch (...)
    {
    }

    throw util::exception(util::format("invalid value '", str, "'"));
}